

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O3

void lm_trie_quant_mwrite
               (lm_trie_quant_t *quant,bitarr_address_t address,int order_minus_2,float32 prob,
               float32 backoff)

{
  byte bVar1;
  uint8 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  bitarr_address_t address_00;
  
  bVar1 = quant->bo_bits;
  uVar2 = quant->prob_bits;
  uVar3 = bins_encode((bins_t *)quant->tables[order_minus_2][0].begin,prob);
  uVar4 = bins_encode((bins_t *)quant->tables[order_minus_2][1].begin,backoff);
  address_00._12_4_ = 0;
  address_00.base = (void *)SUB128(address._0_12_,0);
  address_00.offset = SUB124(address._0_12_,8);
  bitarr_write_int57(address_00,uVar2 + bVar1,uVar3 << (bVar1 & 0x3f) | uVar4);
  return;
}

Assistant:

void
lm_trie_quant_mwrite(lm_trie_quant_t * quant, bitarr_address_t address,
                     int order_minus_2, float32 prob, float32 backoff)
{
    bitarr_write_int57(address, quant->prob_bits + quant->bo_bits,
                       (uint64) ((bins_encode
                                  (&quant->tables[order_minus_2][0],
                                   prob) << quant->
                                  bo_bits) | bins_encode(&quant->
                                                         tables
                                                         [order_minus_2]
                                                         [1],
                                                         backoff)));
}